

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool duckdb::SubtractPropagateStatistics::Operation<int,duckdb::TryDecimalSubtract>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int64_t value;
  int64_t value_00;
  Value local_70;
  
  iVar2 = NumericStats::GetMin<int>(lstats);
  iVar3 = NumericStats::GetMax<int>(rstats);
  if (iVar3 < 0) {
    if (iVar3 + 999999999 < iVar2) goto LAB_00993a8e;
LAB_00993a9f:
    value_00 = (int64_t)(iVar2 - iVar3);
    bVar1 = true;
  }
  else {
    if (iVar3 + -999999999 <= iVar2) goto LAB_00993a9f;
LAB_00993a8e:
    value_00 = 0;
    bVar1 = false;
  }
  if (!bVar1) {
    return true;
  }
  iVar2 = NumericStats::GetMax<int>(lstats);
  iVar3 = NumericStats::GetMin<int>(rstats);
  if (iVar3 < 0) {
    if (iVar3 + 999999999 < iVar2) goto LAB_00993ad1;
  }
  else if (iVar2 < iVar3 + -999999999) {
LAB_00993ad1:
    value = 0;
    bVar1 = false;
    goto LAB_00993ae8;
  }
  value = (int64_t)(iVar2 - iVar3);
  bVar1 = true;
LAB_00993ae8:
  if (bVar1) {
    Value::Numeric(&local_70,type,value_00);
    Value::operator=(new_min,&local_70);
    Value::~Value(&local_70);
    Value::Numeric(&local_70,type,value);
    Value::operator=(new_max,&local_70);
    Value::~Value(&local_70);
  }
  return !bVar1;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		T min, max;
		if (!OP::Operation(NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(rstats), min)) {
			return true;
		}
		if (!OP::Operation(NumericStats::GetMax<T>(lstats), NumericStats::GetMin<T>(rstats), max)) {
			return true;
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}